

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O0

Opnd * __thiscall
LowererMD::EnregisterBoolConst(LowererMD *this,Instr *instr,Opnd *opnd,IRType type)

{
  bool bVar1;
  IRType type_00;
  int iVar2;
  int64 iVar3;
  RegOpnd *pRVar4;
  IntConstOpnd *pIVar5;
  Instr *pIVar6;
  Opnd *pOVar7;
  Instr *cmovInstr;
  RegOpnd *tempReg;
  IRType origType;
  RegOpnd *tempReg_1;
  bool isSet;
  IRType type_local;
  Opnd *opnd_local;
  Instr *instr_local;
  LowererMD *this_local;
  
  bVar1 = IR::Opnd::IsIntConstOpnd(opnd);
  if ((!bVar1) && (bVar1 = IR::Opnd::IsInt64ConstOpnd(opnd), !bVar1)) {
    type_00 = IR::Opnd::GetType(opnd);
    pRVar4 = IR::RegOpnd::New(type_00,this->m_func);
    pIVar5 = IR::IntConstOpnd::New(0,type_00,this->m_func,true);
    pIVar6 = IR::Instr::New(MOV,&pRVar4->super_Opnd,&pIVar5->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar6);
    Legalize<false>(pIVar6,false);
    pOVar7 = IR::Opnd::UseWithNewType(opnd,type_00,this->m_func);
    pIVar6 = IR::Instr::New(SUB,&pRVar4->super_Opnd,&pRVar4->super_Opnd,pOVar7,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar6);
    Legalize<false>(pIVar6,false);
    pIVar5 = IR::IntConstOpnd::New(-1,type_00,this->m_func,true);
    pIVar6 = IR::Instr::New(CMOVS,&pRVar4->super_Opnd,&pRVar4->super_Opnd,&pIVar5->super_Opnd,
                            this->m_func);
    IR::Instr::InsertBefore(instr,pIVar6);
    Legalize<false>(pIVar6,false);
    pOVar7 = IR::Opnd::UseWithNewType(&pRVar4->super_Opnd,type,this->m_func);
    return pOVar7;
  }
  iVar3 = IR::Opnd::GetImmediateValue(opnd,instr->m_func);
  pRVar4 = IR::RegOpnd::New(type,this->m_func);
  iVar2 = 0;
  if (iVar3 != 0) {
    iVar2 = -1;
  }
  pIVar5 = IR::IntConstOpnd::New((long)iVar2,type,this->m_func,true);
  pIVar6 = IR::Instr::New(MOV,&pRVar4->super_Opnd,&pIVar5->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar6);
  return &pRVar4->super_Opnd;
}

Assistant:

IR::Opnd*
LowererMD::EnregisterBoolConst(IR::Instr* instr, IR::Opnd *opnd, IRType type)
{

    if (opnd->IsIntConstOpnd() || opnd->IsInt64ConstOpnd())
    {
        bool isSet = opnd->GetImmediateValue(instr->m_func) != 0;
        IR::RegOpnd *tempReg = IR::RegOpnd::New(type, m_func);
        instr->InsertBefore(IR::Instr::New(Js::OpCode::MOV, tempReg, IR::IntConstOpnd::New(isSet ? -1 : 0, type, m_func, true), m_func));
        return tempReg;
    }

    IRType origType = opnd->GetType();
    IR::RegOpnd *tempReg = IR::RegOpnd::New(origType, m_func);
    IR::Instr* cmovInstr = IR::Instr::New(Js::OpCode::MOV, tempReg, IR::IntConstOpnd::New(0, origType, m_func, true), m_func);
    instr->InsertBefore(cmovInstr);
    Legalize(cmovInstr);
    cmovInstr = IR::Instr::New(Js::OpCode::SUB, tempReg, tempReg, opnd->UseWithNewType(origType, m_func), m_func);
    instr->InsertBefore(cmovInstr);
    Legalize(cmovInstr);
    cmovInstr = IR::Instr::New(Js::OpCode::CMOVS, tempReg, tempReg, IR::IntConstOpnd::New(-1, origType, m_func, true), m_func);
    instr->InsertBefore(cmovInstr);
    Legalize(cmovInstr);
    return tempReg->UseWithNewType(type, m_func);
}